

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageFieldGenerator::GenerateAccessorDeclarations
          (MessageFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  Formatter format;
  Printer *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  
  Formatter::Formatter
            ((Formatter *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff88,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)0x56d180);
  Formatter::operator()
            ((Formatter *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (char *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
             (FieldDescriptor **)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  bVar1 = SupportsArenas((FieldDescriptor *)0x56d1aa);
  if (bVar1) {
    Formatter::operator()
              ((Formatter *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
               (char *)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
               (FieldDescriptor **)format.vars_._M_t._M_impl.super__Rb_tree_header._M_header._0_8_);
  }
  Formatter::~Formatter((Formatter *)0x56d1fc);
  return;
}

Assistant:

void MessageFieldGenerator::GenerateAccessorDeclarations(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  format(
      "$deprecated_attr$const $type$& ${1$$name$$}$() const;\n"
      "$deprecated_attr$$type$* ${1$$release_name$$}$();\n"
      "$deprecated_attr$$type$* ${1$mutable_$name$$}$();\n"
      "$deprecated_attr$void ${1$set_allocated_$name$$}$"
      "($type$* $name$);\n"
      "private:\n"
      "const $type$& ${1$_internal_$name$$}$() const;\n"
      "$type$* ${1$_internal_mutable_$name$$}$();\n"
      "public:\n",
      descriptor_);
  if (SupportsArenas(descriptor_)) {
    format(
        "$deprecated_attr$void "
        "${1$unsafe_arena_set_allocated_$name$$}$(\n"
        "    $type$* $name$);\n"
        "$deprecated_attr$$type$* ${1$unsafe_arena_release_$name$$}$();\n",
        descriptor_);
  }
}